

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distributivity.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::DistributivityRule::ExtractExpression
          (DistributivityRule *this,BoundConjunctionExpression *conj,idx_t idx,Expression *expr)

{
  ExpressionType EVar1;
  bool bVar2;
  uint uVar3;
  pointer pEVar4;
  BoundConjunctionExpression *pBVar5;
  size_type sVar6;
  reference this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> in_RDI;
  undefined8 in_R8;
  idx_t i;
  BoundConjunctionExpression *and_expr;
  value_type *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *result;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffff28;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_ffffffffffffff30;
  BaseExpression *in_stack_ffffffffffffff70;
  Expression *this_01;
  ulong local_58;
  
  this_01 = in_RDI._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xcdbc3f);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff30);
  EVar1 = BaseExpression::GetExpressionType(&pEVar4->super_BaseExpression);
  if (EVar1 == CONJUNCTION_AND) {
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_ffffffffffffff30);
    pBVar5 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>(in_stack_ffffffffffffff70);
    for (local_58 = 0;
        sVar6 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)&pBVar5->children), local_58 < sVar6; local_58 = local_58 + 1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_ffffffffffffff30);
      uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[10])(pEVar4,in_R8);
      if ((uVar3 & 1) != 0) {
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::erase_at((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)this_01,(idx_t)in_RDI._M_head_impl);
        break;
      }
    }
    sVar6 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)&pBVar5->children);
    if (sVar6 == 1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                     0xcdbe21);
  if (!bVar2) {
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<std::default_delete<duckdb::Expression>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              (this_00,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xcdbe7e);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         in_RDI._M_head_impl;
}

Assistant:

unique_ptr<Expression> DistributivityRule::ExtractExpression(BoundConjunctionExpression &conj, idx_t idx,
                                                             Expression &expr) {
	auto &child = conj.children[idx];
	unique_ptr<Expression> result;
	if (child->GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		// AND, remove expression from the list
		auto &and_expr = child->Cast<BoundConjunctionExpression>();
		for (idx_t i = 0; i < and_expr.children.size(); i++) {
			if (and_expr.children[i]->Equals(expr)) {
				result = std::move(and_expr.children[i]);
				and_expr.children.erase_at(i);
				break;
			}
		}
		if (and_expr.children.size() == 1) {
			conj.children[idx] = std::move(and_expr.children[0]);
		}
	}
	// not an AND node(e.g. (X AND B) OR X) or this is the last expr,
	// remove the entire expression
	if (!result) {
		D_ASSERT(child->Equals(expr));
		result = std::move(child);
		conj.children[idx] = nullptr;
	}
	D_ASSERT(result);
	return result;
}